

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_>::
~TypedAttributeWithFallback
          (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *this)

{
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *this_local;
  
  Animatable<tinyusdz::Visibility>::~Animatable(&this->_fallback);
  nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::Visibility>_>::~optional
            (&this->_attrib);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector(&this->_paths);
  AttrMetas::~AttrMetas(&this->_metas);
  return;
}

Assistant:

static std::string type_name() { return value::TypeTraits<T>::type_name(); }